

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::FinishWrapperObjectTracing(Recycler *this)

{
  bool bVar1;
  Recycler *this_local;
  
  do {
    RecyclerCollectionWrapper::EndMarkDomWrapperTracingCallback(this->collectionWrapper);
    ProcessMark(this,false);
    bVar1 = RecyclerCollectionWrapper::EndMarkDomWrapperTracingDoneCallback(this->collectionWrapper)
    ;
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  RecyclerCollectionWrapper::EndMarkDomWrapperTracingCallback(this->collectionWrapper);
  ClearNeedExternalWrapperTracing(this);
  return;
}

Assistant:

void
Recycler::FinishWrapperObjectTracing()
{
    //TODO:akatti:Add ETW event for this.
    // Tracing would have generated more work for mark and marking might generate more work for tracing.
    // We continue until we find no more pending tracing work.
    do
    {
        this->collectionWrapper->EndMarkDomWrapperTracingCallback();
        this->ProcessMark(false);
    } while (!this->collectionWrapper->EndMarkDomWrapperTracingDoneCallback());

    // This is just to wait until tracing has finished.
    this->collectionWrapper->EndMarkDomWrapperTracingCallback();
    this->ClearNeedExternalWrapperTracing();
}